

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_decomposer.hpp
# Opt level: O2

void __thiscall
Catch::UnaryExpr<std::optional<libchess::UCIGoParameters>_&>::streamReconstructedExpression
          (UnaryExpr<std::optional<libchess::UCIGoParameters>_&> *this,ostream *os)

{
  string local_30;
  
  StringRef::operator_cast_to_string(&local_30,(StringRef *)Detail::unprintableString);
  std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }